

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::SoPlexBase(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this)

{
  int iVar1;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  undefined4 in_stack_fffffffffffff558;
  TYPE in_stack_fffffffffffff55c;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff560;
  Settings *this_00;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff568;
  Statistics *newSettings;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff570;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_01;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff578;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff580;
  undefined8 in_stack_fffffffffffff588;
  SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff590;
  shared_ptr<soplex::Tolerances> *in_stack_fffffffffffff598;
  SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff5a0;
  SPxHarrisRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *p;
  SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_fffffffffffff5a8;
  shared_ptr<soplex::Tolerances> *tolerances;
  longlong *in_stack_fffffffffffff5b0;
  SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_02;
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  *in_stack_fffffffffffff5b8;
  SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff5d0;
  undefined8 in_stack_fffffffffffff5e0;
  Setup mode;
  char *in_stack_fffffffffffff5e8;
  SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff5f0;
  undefined8 in_stack_fffffffffffff5f8;
  TYPE ttype;
  SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff600;
  SLUFactorRational *in_stack_fffffffffffff650;
  undefined8 in_stack_fffffffffffff778;
  TYPE ttype_00;
  undefined8 in_stack_fffffffffffff780;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff788;
  undefined8 in_stack_fffffffffffff790;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff798;
  shared_ptr<soplex::Tolerances> local_678;
  undefined1 local_668 [148];
  undefined4 local_5d4;
  undefined4 local_5d0;
  undefined4 local_5cc;
  undefined8 local_5c8;
  undefined1 local_5c0 [56];
  undefined8 local_588;
  undefined1 local_580 [56];
  undefined8 local_548;
  undefined1 local_540 [56];
  undefined8 local_508;
  undefined1 local_500 [56];
  undefined8 local_4c8;
  undefined1 local_4c0 [56];
  undefined8 local_488;
  undefined1 local_480 [56];
  undefined8 local_448;
  undefined1 local_440 [80];
  undefined8 local_3f0;
  undefined1 local_3e8 [80];
  undefined8 local_398;
  undefined1 local_390 [80];
  undefined8 local_340;
  undefined1 local_338 [80];
  undefined8 local_2e8;
  undefined1 local_2e0 [80];
  undefined8 local_290;
  undefined1 local_284 [100];
  Rational *local_220;
  Rational *local_218;
  Rational *local_210;
  Rational *local_208;
  Rational *local_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined4 *local_1e8;
  Rational *local_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined4 *local_1c8;
  Rational *local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined4 *local_1a8;
  Rational *local_1a0;
  undefined4 *local_198;
  undefined4 *local_190;
  undefined4 *local_188;
  undefined8 local_180;
  undefined8 *local_178;
  undefined1 *local_170;
  undefined8 local_168;
  undefined8 *local_160;
  undefined1 *local_158;
  undefined8 local_150;
  undefined8 *local_148;
  undefined1 *local_140;
  undefined8 local_138;
  undefined8 *local_130;
  undefined1 *local_128;
  undefined8 local_120;
  undefined8 *local_118;
  undefined1 *local_110;
  undefined8 local_108;
  undefined8 *local_100;
  undefined1 *local_f8;
  undefined8 *local_f0;
  undefined8 *local_e8;
  undefined8 *local_e0;
  undefined8 *local_d8;
  undefined8 *local_d0;
  undefined8 *local_c8;
  undefined8 local_c0;
  undefined8 *local_b8;
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined8 *local_a0;
  undefined1 *local_98;
  undefined8 local_90;
  undefined8 *local_88;
  undefined1 *local_80;
  undefined8 local_78;
  undefined8 *local_70;
  undefined1 *local_68;
  undefined8 local_60;
  undefined8 *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined8 *local_40;
  undefined1 *local_38;
  undefined8 *local_30;
  undefined8 *local_28;
  undefined8 *local_20;
  undefined8 *local_18;
  undefined8 *local_10;
  undefined8 *local_8;
  
  ttype = (TYPE)((ulong)in_stack_fffffffffffff5f8 >> 0x20);
  mode = (Setup)((ulong)in_stack_fffffffffffff5e0 >> 0x20);
  ttype_00 = (TYPE)((ulong)in_stack_fffffffffffff778 >> 0x20);
  in_RDI->_vptr_SoPlexBase = (_func_int **)&PTR__SoPlexBase_0089c070;
  SPxOut::SPxOut((SPxOut *)in_stack_fffffffffffff560);
  in_RDI->_statistics = (Statistics *)0x0;
  in_RDI->_currentSettings = (Settings *)0x0;
  std::shared_ptr<soplex::Tolerances>::shared_ptr((shared_ptr<soplex::Tolerances> *)0x49fc13);
  local_220 = &in_RDI->_rationalPosInfty;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)0x49fc3c);
  local_218 = &in_RDI->_rationalNegInfty;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)0x49fc69);
  local_210 = &in_RDI->_rationalFeastol;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)0x49fc98);
  local_208 = &in_RDI->_rationalOpttol;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)0x49fcc7);
  local_200 = &in_RDI->_rationalMaxscaleincr;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)0x49fcf6);
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxSolverBase(in_stack_fffffffffffff798,(Type)((ulong)in_stack_fffffffffffff790 >> 0x20),
                  (Representation)in_stack_fffffffffffff790,
                  (TYPE)((ulong)in_stack_fffffffffffff788 >> 0x20));
  SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SLUFactor(in_stack_fffffffffffff600);
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxMainSM((SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)in_stack_fffffffffffff600,ttype);
  Presol<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::Presol((Presol<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)in_stack_fffffffffffff560,in_stack_fffffffffffff55c);
  SPxEquiliSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxEquiliSC((SPxEquiliSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)in_stack_fffffffffffff560,SUB41(in_stack_fffffffffffff55c >> 0x18,0));
  SPxEquiliSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxEquiliSC((SPxEquiliSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)in_stack_fffffffffffff560,SUB41(in_stack_fffffffffffff55c >> 0x18,0));
  local_290 = 0x3feb333333333333;
  local_b0 = local_284;
  local_b8 = &local_290;
  local_c0 = 0;
  local_8 = local_b8;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff570,
             (double)in_stack_fffffffffffff568,in_stack_fffffffffffff560);
  local_2e8 = 0x408f400000000000;
  local_98 = local_2e0;
  local_a0 = &local_2e8;
  local_a8 = 0;
  local_10 = local_a0;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff570,
             (double)in_stack_fffffffffffff568,in_stack_fffffffffffff560);
  SPxGeometSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxGeometSC((SPxGeometSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)in_stack_fffffffffffff580,SUB81((ulong)in_stack_fffffffffffff578 >> 0x38,0),
                (int)in_stack_fffffffffffff578,
                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)in_stack_fffffffffffff570,in_stack_fffffffffffff568);
  local_340 = 0x3feb333333333333;
  local_80 = local_338;
  local_88 = &local_340;
  local_90 = 0;
  local_18 = local_88;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff570,
             (double)in_stack_fffffffffffff568,in_stack_fffffffffffff560);
  local_398 = 0x408f400000000000;
  local_68 = local_390;
  local_70 = &local_398;
  local_78 = 0;
  local_20 = local_70;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff570,
             (double)in_stack_fffffffffffff568,in_stack_fffffffffffff560);
  SPxGeometSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxGeometSC((SPxGeometSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)in_stack_fffffffffffff580,SUB81((ulong)in_stack_fffffffffffff578 >> 0x38,0),
                (int)in_stack_fffffffffffff578,
                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)in_stack_fffffffffffff570,in_stack_fffffffffffff568);
  local_3f0 = 0x3feb333333333333;
  local_50 = local_3e8;
  local_58 = &local_3f0;
  local_60 = 0;
  local_28 = local_58;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff570,
             (double)in_stack_fffffffffffff568,in_stack_fffffffffffff560);
  local_448 = 0x408f400000000000;
  local_38 = local_440;
  local_40 = &local_448;
  local_48 = 0;
  local_30 = local_40;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff570,
             (double)in_stack_fffffffffffff568,in_stack_fffffffffffff560);
  SPxGeometSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxGeometSC((SPxGeometSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)in_stack_fffffffffffff580,SUB81((ulong)in_stack_fffffffffffff578 >> 0x38,0),
                (int)in_stack_fffffffffffff578,
                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)in_stack_fffffffffffff570,in_stack_fffffffffffff568);
  SPxLeastSqSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxLeastSqSC((SPxLeastSqSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_fffffffffffff580);
  SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxWeightST((SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)in_stack_fffffffffffff590);
  SPxSumST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxSumST((SPxSumST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)in_stack_fffffffffffff560);
  SPxVectorST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxVectorST((SPxVectorST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)in_stack_fffffffffffff570);
  SPxAutoPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxAutoPR((SPxAutoPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)in_stack_fffffffffffff570);
  SPxDantzigPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxDantzigPR((SPxDantzigPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_fffffffffffff560);
  SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxParMultPR((SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_fffffffffffff570);
  SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxDevexPR(in_stack_fffffffffffff590);
  SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxSteepPR(in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,mode);
  SPxSteepExPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxSteepExPR((SPxSteepExPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_fffffffffffff560);
  SPxDefaultRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxDefaultRT((SPxDefaultRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_fffffffffffff560);
  SPxHarrisRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxHarrisRT((SPxHarrisRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)in_stack_fffffffffffff560);
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxFastRT(in_stack_fffffffffffff580);
  SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxBoundFlippingRT(in_stack_fffffffffffff5d0);
  in_RDI->_simplifier =
       (SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  in_RDI->_scaler =
       (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  in_RDI->_starter =
       (SPxStarter<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxSolverBase(in_stack_fffffffffffff788,(Type)((ulong)in_stack_fffffffffffff780 >> 0x20),
                  (Representation)in_stack_fffffffffffff780,ttype_00);
  in_RDI->_initialPrecision = 0x32;
  in_RDI->_tolPrecisionRatio = 0.65;
  in_RDI->_epsZeroPrecisionRatio = 1.0;
  in_RDI->_epsFactorPrecisionRatio = 1.25;
  in_RDI->_epsUpdatePrecisionRatio = 1.0;
  in_RDI->_epsPivotPrecisionRatio = 0.625;
  SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SLUFactor((SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)in_stack_fffffffffffff600);
  SPxAutoPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxAutoPR((SPxAutoPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)in_stack_fffffffffffff570);
  SPxDantzigPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxDantzigPR((SPxDantzigPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_fffffffffffff560);
  SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxParMultPR((SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_fffffffffffff570);
  SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxDevexPR((SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_stack_fffffffffffff590);
  SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxSteepPR((SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,mode);
  SPxSteepExPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxSteepExPR((SPxSteepExPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_fffffffffffff560);
  SPxDefaultRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxDefaultRT((SPxDefaultRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_fffffffffffff560);
  SPxHarrisRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxHarrisRT((SPxHarrisRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)in_stack_fffffffffffff560);
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxFastRT((SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)in_stack_fffffffffffff580);
  SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxBoundFlippingRT
            ((SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)in_stack_fffffffffffff5d0);
  SPxEquiliSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxEquiliSC((SPxEquiliSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)in_stack_fffffffffffff560,SUB41(in_stack_fffffffffffff55c >> 0x18,0));
  SPxEquiliSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxEquiliSC((SPxEquiliSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)in_stack_fffffffffffff560,SUB41(in_stack_fffffffffffff55c >> 0x18,0));
  local_488 = 0x3feb333333333333;
  local_170 = local_480;
  local_178 = &local_488;
  local_180 = 0;
  local_c8 = local_178;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff570,
             (double)in_stack_fffffffffffff568,in_stack_fffffffffffff560);
  local_4c8 = 0x408f400000000000;
  local_158 = local_4c0;
  local_160 = &local_4c8;
  local_168 = 0;
  local_d0 = local_160;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff570,
             (double)in_stack_fffffffffffff568,in_stack_fffffffffffff560);
  SPxGeometSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxGeometSC((SPxGeometSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)in_stack_fffffffffffff580,SUB81((ulong)in_stack_fffffffffffff578 >> 0x38,0),
                (int)in_stack_fffffffffffff578,
                (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)in_stack_fffffffffffff570,
                (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)in_stack_fffffffffffff568);
  local_508 = 0x3feb333333333333;
  local_140 = local_500;
  local_148 = &local_508;
  local_150 = 0;
  local_d8 = local_148;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff570,
             (double)in_stack_fffffffffffff568,in_stack_fffffffffffff560);
  local_548 = 0x408f400000000000;
  local_128 = local_540;
  local_130 = &local_548;
  local_138 = 0;
  local_e0 = local_130;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff570,
             (double)in_stack_fffffffffffff568,in_stack_fffffffffffff560);
  SPxGeometSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxGeometSC((SPxGeometSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)in_stack_fffffffffffff580,SUB81((ulong)in_stack_fffffffffffff578 >> 0x38,0),
                (int)in_stack_fffffffffffff578,
                (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)in_stack_fffffffffffff570,
                (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)in_stack_fffffffffffff568);
  local_588 = 0x3feb333333333333;
  local_110 = local_580;
  local_118 = &local_588;
  local_120 = 0;
  local_e8 = local_118;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff570,
             (double)in_stack_fffffffffffff568,in_stack_fffffffffffff560);
  local_5c8 = 0x408f400000000000;
  local_f8 = local_5c0;
  local_100 = &local_5c8;
  local_108 = 0;
  local_f0 = local_100;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff570,
             (double)in_stack_fffffffffffff568,in_stack_fffffffffffff560);
  SPxGeometSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxGeometSC((SPxGeometSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)in_stack_fffffffffffff580,SUB81((ulong)in_stack_fffffffffffff578 >> 0x38,0),
                (int)in_stack_fffffffffffff578,
                (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)in_stack_fffffffffffff570,
                (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)in_stack_fffffffffffff568);
  SPxLeastSqSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxLeastSqSC((SPxLeastSqSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_fffffffffffff580);
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxMainSM((SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)in_stack_fffffffffffff600,ttype);
  Presol<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::Presol((Presol<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)in_stack_fffffffffffff560,in_stack_fffffffffffff55c);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x4a08d6);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x4a08f4);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x4a0912);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x4a0930);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x4a094e);
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxLPBase(in_stack_fffffffffffff578);
  in_RDI->_rationalLP = (SPxLPRational *)0x0;
  SLUFactorRational::SLUFactorRational(in_stack_fffffffffffff650);
  DataArray<int>::DataArray
            ((DataArray<int> *)in_stack_fffffffffffff570,
             (int)((ulong)in_stack_fffffffffffff568 >> 0x20),(int)in_stack_fffffffffffff568,
             (Real)in_stack_fffffffffffff560);
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::LPColSetBase((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)in_stack_fffffffffffff590,(int)((ulong)in_stack_fffffffffffff588 >> 0x20),
                 (int)in_stack_fffffffffffff588);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)0x4a0a02);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)0x4a0a20);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)0x4a0a3e);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)0x4a0a5c);
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::DSVectorBase((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)in_stack_fffffffffffff570,(int)((ulong)in_stack_fffffffffffff568 >> 0x20));
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)0x4a0a9d);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)0x4a0abb);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)0x4a0ad9);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)0x4a0af7);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)0x4a0b15);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)0x4a0b33);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)0x4a0b51);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)0x4a0b6f);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)0x4a0b8d);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)0x4a0bab);
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::DSVectorBase((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)in_stack_fffffffffffff570,(int)((ulong)in_stack_fffffffffffff568 >> 0x20));
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  ::DataArray((DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
               *)in_stack_fffffffffffff570,(int)((ulong)in_stack_fffffffffffff568 >> 0x20),
              (int)in_stack_fffffffffffff568,(Real)in_stack_fffffffffffff560);
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  ::DataArray((DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
               *)in_stack_fffffffffffff570,(int)((ulong)in_stack_fffffffffffff568 >> 0x20),
              (int)in_stack_fffffffffffff568,(Real)in_stack_fffffffffffff560);
  Array<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_*>
  ::Array((Array<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_*>
           *)in_stack_fffffffffffff570,(int)((ulong)in_stack_fffffffffffff568 >> 0x20));
  DataArray<soplex::SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::RangeType>
  ::DataArray((DataArray<soplex::SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::RangeType>
               *)in_stack_fffffffffffff570,(int)((ulong)in_stack_fffffffffffff568 >> 0x20),
              (int)in_stack_fffffffffffff568,(Real)in_stack_fffffffffffff560);
  DataArray<soplex::SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::RangeType>
  ::DataArray((DataArray<soplex::SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::RangeType>
               *)in_stack_fffffffffffff570,(int)((ulong)in_stack_fffffffffffff568 >> 0x20),
              (int)in_stack_fffffffffffff568,(Real)in_stack_fffffffffffff560);
  in_RDI->_status = UNKNOWN;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  ::DataArray((DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
               *)in_stack_fffffffffffff570,(int)((ulong)in_stack_fffffffffffff568 >> 0x20),
              (int)in_stack_fffffffffffff568,(Real)in_stack_fffffffffffff560);
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  ::DataArray((DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
               *)in_stack_fffffffffffff570,(int)((ulong)in_stack_fffffffffffff568 >> 0x20),
              (int)in_stack_fffffffffffff568,(Real)in_stack_fffffffffffff560);
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  ::DataArray((DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
               *)in_stack_fffffffffffff570,(int)((ulong)in_stack_fffffffffffff568 >> 0x20),
              (int)in_stack_fffffffffffff568,(Real)in_stack_fffffffffffff560);
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  ::DataArray((DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
               *)in_stack_fffffffffffff570,(int)((ulong)in_stack_fffffffffffff568 >> 0x20),
              (int)in_stack_fffffffffffff568,(Real)in_stack_fffffffffffff560);
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  ::DataArray((DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
               *)in_stack_fffffffffffff570,(int)((ulong)in_stack_fffffffffffff568 >> 0x20),
              (int)in_stack_fffffffffffff568,(Real)in_stack_fffffffffffff560);
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  ::DataArray((DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
               *)in_stack_fffffffffffff570,(int)((ulong)in_stack_fffffffffffff568 >> 0x20),
              (int)in_stack_fffffffffffff568,(Real)in_stack_fffffffffffff560);
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  ::DataArray((DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
               *)in_stack_fffffffffffff570,(int)((ulong)in_stack_fffffffffffff568 >> 0x20),
              (int)in_stack_fffffffffffff568,(Real)in_stack_fffffffffffff560);
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  ::DataArray((DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
               *)in_stack_fffffffffffff570,(int)((ulong)in_stack_fffffffffffff568 >> 0x20),
              (int)in_stack_fffffffffffff568,(Real)in_stack_fffffffffffff560);
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  ::DataArray((DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
               *)in_stack_fffffffffffff570,(int)((ulong)in_stack_fffffffffffff568 >> 0x20),
              (int)in_stack_fffffffffffff568,(Real)in_stack_fffffffffffff560);
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  ::DataArray((DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
               *)in_stack_fffffffffffff570,(int)((ulong)in_stack_fffffffffffff568 >> 0x20),
              (int)in_stack_fffffffffffff568,(Real)in_stack_fffffffffffff560);
  SolBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SolBase((SolBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)in_stack_fffffffffffff5a0);
  SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::SolBase(in_stack_fffffffffffff5a8);
  SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::SolBase(in_stack_fffffffffffff5a8);
  in_RDI->_hasBasis = false;
  in_RDI->_hasSolReal = false;
  in_RDI->_hasSolRational = false;
  local_1e0 = &in_RDI->_rationalPosone;
  local_5cc = 1;
  local_1e8 = &local_5cc;
  local_1f0 = 0;
  local_1f8 = 1;
  local_188 = local_1e8;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor<long_long>
            (in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
  local_1c0 = &in_RDI->_rationalNegone;
  local_5d0 = 0xffffffff;
  local_1c8 = &local_5d0;
  local_1d0 = 0;
  local_1d8 = 0xffffffffffffffff;
  local_190 = local_1c8;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor<long_long>
            (in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
  local_1a0 = &in_RDI->_rationalZero;
  local_5d4 = 0;
  local_1a8 = &local_5d4;
  local_1b0 = 0;
  local_1b8 = 0;
  local_198 = local_1a8;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor<long_long>
            (in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
  std::make_shared<soplex::Tolerances>();
  std::shared_ptr<soplex::Tolerances>::operator=
            ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff560,
             (shared_ptr<soplex::Tolerances> *)
             CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x4a1089);
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff560,
             (shared_ptr<soplex::Tolerances> *)
             CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setTolerances(in_stack_fffffffffffff570,
                  (shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff568);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x4a10e0);
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff560,
             (shared_ptr<soplex::Tolerances> *)
             CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setTolerances((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)in_stack_fffffffffffff570,
                  (shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff568);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x4a1136);
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setTolerances((SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)in_stack_fffffffffffff560,
                  (shared_ptr<soplex::Tolerances> *)
                  CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setTolerances((SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)in_stack_fffffffffffff560,
                  (shared_ptr<soplex::Tolerances> *)
                  CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setTolerances((SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)in_stack_fffffffffffff560,
                  (shared_ptr<soplex::Tolerances> *)
                  CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setTolerances((SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)in_stack_fffffffffffff560,
                  (shared_ptr<soplex::Tolerances> *)
                  CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setTolerances((SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)in_stack_fffffffffffff560,
                  (shared_ptr<soplex::Tolerances> *)
                  CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setTolerances((SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)in_stack_fffffffffffff560,
                  (shared_ptr<soplex::Tolerances> *)
                  CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setTolerances((SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)in_stack_fffffffffffff560,
                  (shared_ptr<soplex::Tolerances> *)
                  CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setTolerances((SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)in_stack_fffffffffffff560,
                  (shared_ptr<soplex::Tolerances> *)
                  CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setTolerances((SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)in_stack_fffffffffffff560,
                  (shared_ptr<soplex::Tolerances> *)
                  CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setTolerances((SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)in_stack_fffffffffffff560,
                  (shared_ptr<soplex::Tolerances> *)
                  CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setTolerances((SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)in_stack_fffffffffffff560,
                  (shared_ptr<soplex::Tolerances> *)
                  CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setTolerances((SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)in_stack_fffffffffffff560,
                  (shared_ptr<soplex::Tolerances> *)
                  CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff560,
             (shared_ptr<soplex::Tolerances> *)
             CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setTolerances(in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x4a12ea);
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff560,
             (shared_ptr<soplex::Tolerances> *)
             CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setTolerances((SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)in_stack_fffffffffffff560,
                  (shared_ptr<soplex::Tolerances> *)
                  CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x4a1340);
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff560,
             (shared_ptr<soplex::Tolerances> *)
             CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setTolerances((SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)in_stack_fffffffffffff560,
                  (shared_ptr<soplex::Tolerances> *)
                  CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x4a1396);
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff560,
             (shared_ptr<soplex::Tolerances> *)
             CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setTolerances((SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)in_stack_fffffffffffff560,
                  (shared_ptr<soplex::Tolerances> *)
                  CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x4a13ec);
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff560,
             (shared_ptr<soplex::Tolerances> *)
             CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setTolerances((SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x4a1436);
  iVar1 = (int)((ulong)local_668 >> 0x20);
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff560,
             (shared_ptr<soplex::Tolerances> *)
             CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setTolerances((SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)in_stack_fffffffffffff560,
                  (shared_ptr<soplex::Tolerances> *)
                  CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x4a1479);
  p = &in_RDI->_boostedRatiotesterHarris;
  tolerances = &local_678;
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff560,
             (shared_ptr<soplex::Tolerances> *)
             CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setTolerances((SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)in_stack_fffffffffffff560,
                  (shared_ptr<soplex::Tolerances> *)
                  CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x4a14bc);
  this_02 = (SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)&in_RDI->_boostedRatiotesterTextbook;
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff560,
             (shared_ptr<soplex::Tolerances> *)
             CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setTolerances((SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)in_stack_fffffffffffff560,
                  (shared_ptr<soplex::Tolerances> *)
                  CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x4a14ff);
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff560,
             (shared_ptr<soplex::Tolerances> *)
             CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setTolerances(this_02,tolerances);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x4a1547);
  this_01 = (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)&in_RDI->_boostedSlufactor;
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff560,
             (shared_ptr<soplex::Tolerances> *)
             CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setTolerances((SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)this_02,tolerances);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x4a158c);
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setOutstream(&in_RDI->_solver,&in_RDI->spxout);
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setOutstream(&(in_RDI->_scalerUniequi).
                  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ,&in_RDI->spxout);
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setOutstream(&(in_RDI->_scalerBiequi).
                  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ,&in_RDI->spxout);
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setOutstream(&(in_RDI->_scalerGeo1).
                  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ,&in_RDI->spxout);
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setOutstream(&(in_RDI->_scalerGeo8).
                  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ,&in_RDI->spxout);
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setOutstream(&(in_RDI->_scalerGeoequi).
                  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ,&in_RDI->spxout);
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setOutstream(&(in_RDI->_scalerLeastsq).
                  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ,&in_RDI->spxout);
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setBasisSolver(in_stack_fffffffffffff560,
                   (SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558),false);
  in_RDI->_realLP =
       &(in_RDI->_solver).
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ;
  in_RDI->_isRealLPLoaded = true;
  in_RDI->_isRealLPScaled = false;
  in_RDI->_applyPolishing = false;
  in_RDI->_optimizeCalls = 0;
  in_RDI->_unscaleCalls = 0;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setOutstream(in_RDI->_realLP,&in_RDI->spxout);
  spx_alloc<soplex::SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::Statistics*>
            ((Statistics **)p,iVar1);
  newSettings = in_RDI->_statistics;
  Statistics::Statistics((Statistics *)in_stack_fffffffffffff560,in_stack_fffffffffffff55c);
  in_RDI->_statistics = newSettings;
  spx_alloc<soplex::SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::Settings*>
            ((Settings **)p,iVar1);
  this_00 = in_RDI->_currentSettings;
  Settings::Settings(this_00);
  in_RDI->_currentSettings = this_00;
  setSettings(this_01,(Settings *)newSettings,SUB81((ulong)this_00 >> 0x38,0));
  iVar1 = intParam(in_RDI,SOLVEMODE);
  in_RDI->_lastSolveMode = iVar1;
  SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setOutstream(&(in_RDI->_simplifierPaPILO).
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ,&in_RDI->spxout);
  return;
}

Assistant:

SoPlexBase<R>::SoPlexBase()
   : _statistics(nullptr)
   , _currentSettings(nullptr)
   , _scalerUniequi(false)
   , _scalerBiequi(true)
   , _scalerGeo1(false, 1)
   , _scalerGeo8(false, 8)
   , _scalerGeoequi(true)
   , _scalerLeastsq()
   , _simplifier(nullptr)
   , _scaler(nullptr)
   , _starter(nullptr)
   , _rationalLP(nullptr)
   , _unitMatrixRational(0)
   , _status(SPxSolverBase<R>::UNKNOWN)
   , _hasBasis(false)
   , _hasSolReal(false)
   , _hasSolRational(false)
   , _rationalPosone(1)
   , _rationalNegone(-1)
   , _rationalZero(0)
{
   _tolerances = std::make_shared<Tolerances>();
   _solver.setTolerances(_tolerances);
   _boostedSolver.setTolerances(_tolerances);
   // set tolerances for scalers
   _scalerUniequi.setTolerances(_tolerances);
   _scalerBiequi.setTolerances(_tolerances);
   _scalerGeo1.setTolerances(_tolerances);
   _scalerGeo8.setTolerances(_tolerances);
   _scalerGeoequi.setTolerances(_tolerances);
   _scalerLeastsq.setTolerances(_tolerances);

   _boostedScalerUniequi.setTolerances(_tolerances);
   _boostedScalerBiequi.setTolerances(_tolerances);
   _boostedScalerGeo1.setTolerances(_tolerances);
   _boostedScalerGeo8.setTolerances(_tolerances);
   _boostedScalerGeoequi.setTolerances(_tolerances);
   _boostedScalerLeastsq.setTolerances(_tolerances);

   // set tolerances for ratio testers
   _ratiotesterBoundFlipping.setTolerances(_tolerances);
   _ratiotesterFast.setTolerances(_tolerances);
   _ratiotesterHarris.setTolerances(_tolerances);
   _ratiotesterTextbook.setTolerances(_tolerances);

   _boostedRatiotesterBoundFlipping.setTolerances(_tolerances);
   _boostedRatiotesterFast.setTolerances(_tolerances);
   _boostedRatiotesterHarris.setTolerances(_tolerances);
   _boostedRatiotesterTextbook.setTolerances(_tolerances);

   // set tolerances for slufactor
   _slufactor.setTolerances(_tolerances);
   _boostedSlufactor.setTolerances(_tolerances);
   // transfer message handler
   _solver.setOutstream(spxout);
   _scalerUniequi.setOutstream(spxout);
   _scalerBiequi.setOutstream(spxout);
   _scalerGeo1.setOutstream(spxout);
   _scalerGeo8.setOutstream(spxout);
   _scalerGeoequi.setOutstream(spxout);
   _scalerLeastsq.setOutstream(spxout);

   // give lu factorization to solver
   _solver.setBasisSolver(&_slufactor);

#ifdef SOPLEX_WITH_MPFR
   // set initial precision
   BP::default_precision(_initialPrecision);

   _boostedSolver.setOutstream(spxout);
   _boostedScalerUniequi.setOutstream(spxout);
   _boostedScalerBiequi.setOutstream(spxout);
   _boostedScalerGeo1.setOutstream(spxout);
   _boostedScalerGeo8.setOutstream(spxout);
   _boostedScalerGeoequi.setOutstream(spxout);
   _boostedScalerLeastsq.setOutstream(spxout);

   _boostedSolver.setBasisSolver(&_boostedSlufactor);

   _lastStallPrecBoosts = 0;
   _factorSolNewBasisPrecBoost = true;
   _nextRatrecPrecBoost = 0;
   _prevIterations = 0;

   _switchedToBoosted = false;

   _certificateMode = 0;
   _hasOldBasis     = false;
   _hasOldFeasBasis = false;
   _hasOldUnbdBasis = false;

   _boostingLimitReached = false;
#endif

   // the R LP is initially stored in the solver; the rational LP is constructed, when the parameter SYNCMODE is
   // initialized in setSettings() below
   _realLP = &_solver;
   _isRealLPLoaded = true;
   _isRealLPScaled = false;
   _applyPolishing = false;
   _optimizeCalls = 0;
   _unscaleCalls = 0;
   _realLP->setOutstream(spxout);

   // initialize statistics
   spx_alloc(_statistics);
   _statistics = new(_statistics) Statistics();

   // initialize parameter settings to default
   spx_alloc(_currentSettings);
   _currentSettings = new(_currentSettings) Settings();
   setSettings(*_currentSettings, true);

   _lastSolveMode = intParam(SoPlexBase<R>::SOLVEMODE);

   _simplifierPaPILO.setOutstream(spxout);

   assert(_isConsistent());
}